

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_mgga_xc_b88b95.c
# Opt level: O1

void xc_hyb_mgga_xc_pw6b95_init(xc_func_type *p)

{
  xc_mix_init(p,2,xc_hyb_mgga_xc_pw6b95_init::funcs_id,xc_hyb_mgga_xc_pw6b95_init::funcs_coef);
  xc_func_set_ext_params(*p->func_aux,xc_hyb_mgga_xc_pw6b95_init::par_x_pw91);
  xc_func_set_ext_params(p->func_aux[1],xc_hyb_mgga_xc_pw6b95_init::par_c_bc95);
  xc_hyb_init_hybrid(p,0.28);
  return;
}

Assistant:

void
xc_hyb_mgga_xc_pw6b95_init(xc_func_type *p)
{
  static int    funcs_id  [2] = {XC_GGA_X_MPW91, XC_MGGA_C_BC95};
  static double funcs_coef[2] = {1.0 - 0.28, 1.0};

  static double par_x_pw91[] = {0.00538, 1.7382/(X2S*X2S), 3.8901};
  static double par_c_bc95[] = {0.03668, 0.00262};

  xc_mix_init(p, 2, funcs_id, funcs_coef);
  xc_func_set_ext_params(p->func_aux[0], par_x_pw91);
  xc_func_set_ext_params(p->func_aux[1], par_c_bc95);

  xc_hyb_init_hybrid(p, 0.28);
}